

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O1

int stopcheck2(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol
              ,double stol)

{
  int iVar1;
  double *array;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  array = (double *)malloc((long)N * 8);
  if (0 < N) {
    dVar3 = ABS(fx);
    if (ABS(fx) <= ABS(fsval)) {
      dVar3 = ABS(fsval);
    }
    uVar2 = 0;
    do {
      dVar4 = ABS(xf[uVar2]);
      if (ABS(xf[uVar2]) <= 1.0 / ABS(dx[uVar2])) {
        dVar4 = 1.0 / ABS(dx[uVar2]);
      }
      array[uVar2] = (ABS(jac[uVar2]) * dVar4) / dVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  dVar3 = array_max_abs(array,N);
  iVar1 = 1;
  if (gtol < dVar3) {
    if (0 < N) {
      uVar2 = 0;
      do {
        dVar3 = ABS(xf[uVar2]);
        if (dVar3 <= 1.0 / ABS(dx[uVar2])) {
          dVar3 = 1.0 / ABS(dx[uVar2]);
        }
        array[uVar2] = ABS(xf[uVar2] - xc[uVar2]) / dVar3;
        uVar2 = uVar2 + 1;
      } while ((uint)N != uVar2);
    }
    dVar3 = array_max_abs(array,N);
    iVar1 = 0;
    if (dVar3 <= stol) {
      iVar1 = 2;
    }
  }
  free(array);
  return iVar1;
}

Assistant:

int stopcheck2(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol,double stol) {
	int rcode,i;
	double num,den;
	double stop0;
	double *scheck;
	
	rcode = 0;	
	
	scheck = (double*) malloc(sizeof(double) *N);
	
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xf[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol) {
		rcode = 1;
	} else {
		for(i = 0; i < N;++i) {
			if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
				den = fabs(xf[i]);
			} else {
				den = 1.0 / fabs(dx[i]);
			}
			num = fabs(xf[i] - xc[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck,N);
		if (stop0 <= stol) {
			rcode = 2;
		}
	}
	
	free(scheck);
	return rcode;
}